

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.cpp
# Opt level: O1

void __thiscall
chrono::ChTimestepperNewmark::ArchiveOUT(ChTimestepperNewmark *this,ChArchiveOut *archive)

{
  char *local_38;
  double *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChTimestepperNewmark>(archive);
  ChTimestepper::ArchiveOUT((ChTimestepper *)this,archive);
  ChImplicitIterativeTimestepper::ArchiveOUT(&this->super_ChImplicitIterativeTimestepper,archive);
  local_30 = &this->beta;
  local_38 = "beta";
  local_28 = 0;
  (*(archive->super_ChArchive)._vptr_ChArchive[4])(archive,&local_38);
  local_30 = &this->gamma;
  local_38 = "gamma";
  local_28 = 0;
  (*(archive->super_ChArchive)._vptr_ChArchive[4])(archive,&local_38);
  return;
}

Assistant:

void ChTimestepperNewmark::ArchiveOUT(ChArchiveOut& archive) {
    // version number
    archive.VersionWrite<ChTimestepperNewmark>();
    // serialize parent class:
    ChTimestepperIIorder::ArchiveOUT(archive);
    ChImplicitIterativeTimestepper::ArchiveOUT(archive);
    // serialize all member data:
    archive << CHNVP(beta);
    archive << CHNVP(gamma);
}